

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf-test.cpp
# Opt level: O2

void UTF_fgets_test2(char *fname)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  char buf [128];
  
  __stream = fopen(fname,"rb");
  if (__stream != (FILE *)0x0) {
    pcVar2 = UTF_fgets<char>(buf,10,(FILE *)__stream);
    UTF_test(0x83,pcVar2 == buf);
    iVar1 = bcmp(buf,"012345678",10);
    UTF_test(0x84,iVar1 == 0);
    pcVar2 = UTF_fgets<char>(buf,10,(FILE *)__stream);
    UTF_test(0x85,pcVar2 == buf);
    iVar1 = bcmp(buf,"901234567",10);
    UTF_test(0x86,iVar1 == 0);
    pcVar2 = UTF_fgets<char>(buf,10,(FILE *)__stream);
    UTF_test(0x87,pcVar2 == buf);
    iVar1 = bcmp(buf,"890123456",10);
    UTF_test(0x88,iVar1 == 0);
    pcVar2 = UTF_fgets<char>(buf,10,(FILE *)__stream);
    UTF_test(0x89,pcVar2 == buf);
    iVar1 = bcmp(buf,"78901234",9);
    UTF_test(0x8a,iVar1 == 0);
    pcVar2 = UTF_fgets<char>(buf,10,(FILE *)__stream);
    UTF_test(0x8b,pcVar2 == (char *)0x0);
    fclose(__stream);
    return;
  }
  UTF_test(0x7f,false);
  return;
}

Assistant:

void UTF_fgets_test2(const char *fname)
{
    FILE *fp;
    char buf[128];

    fp = fopen(fname, "rb");
    if (!fp)
    {
        UTF_test(__LINE__, fp != NULL);
        return;
    }

    UTF_test(__LINE__, UTF_fgets(buf, 10, fp) == buf);
    UTF_test(__LINE__, strcmp(buf, "012345678") == 0);
    UTF_test(__LINE__, UTF_fgets(buf, 10, fp) == buf);
    UTF_test(__LINE__, strcmp(buf, "901234567") == 0);
    UTF_test(__LINE__, UTF_fgets(buf, 10, fp) == buf);
    UTF_test(__LINE__, strcmp(buf, "890123456") == 0);
    UTF_test(__LINE__, UTF_fgets(buf, 10, fp) == buf);
    UTF_test(__LINE__, strcmp(buf, "78901234") == 0);
    UTF_test(__LINE__, UTF_fgets(buf, 10, fp) == NULL);

    fclose(fp);
}